

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

uint16_t Unpack16(uint8_t *p,size_t offset)

{
  return *(ushort *)(p + offset) << 8 | *(ushort *)(p + offset) >> 8;
}

Assistant:

uint16_t Unpack16(const uint8_t* p, size_t offset)
{
    uint16_t rc = 0;
    for (int i = 0; i < 2; i++)
    {
        rc <<= 8;
        rc |= p[offset++];
    }
    return rc;
}